

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O0

void tx_crash_recover_test(void)

{
  fdb_status fVar1;
  char *test_file_c;
  char *test_file;
  uint64_t bid;
  fdb_file_info file_info;
  fdb_kvs_config kvs_config;
  fdb_config config;
  fdb_status status;
  fdb_kvs_handle *kvs;
  fdb_file_handle *file;
  size_t vallen;
  void *val;
  char str [15];
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle *in_stack_fffffffffffffc98;
  fdb_file_handle *in_stack_fffffffffffffca0;
  fdb_isolation_level_t isolation_level;
  fdb_file_handle *in_stack_fffffffffffffca8;
  size_t in_stack_fffffffffffffcb0;
  fdb_kvs_handle *in_stack_fffffffffffffcb8;
  fdb_file_info *in_stack_fffffffffffffcc0;
  fdb_kvs_handle *in_stack_fffffffffffffcc8;
  fdb_file_info *in_stack_fffffffffffffcd0;
  fdb_kvs_handle *in_stack_fffffffffffffcd8;
  undefined1 local_2f8 [248];
  char *local_200;
  char *local_1f8;
  ulong local_1f0;
  ulong local_1c0;
  undefined1 local_188 [4];
  uint local_184;
  fdb_config *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  fdb_file_handle **in_stack_fffffffffffffec8;
  fdb_status local_8c;
  fdb_kvs_handle *local_88;
  void *local_70;
  fdb_file_info local_67;
  timeval local_10;
  
  gettimeofday(&local_10,(__timezone_ptr_t)0x0);
  local_67._55_8_ = local_10.tv_sec;
  local_67._63_8_ = local_10.tv_usec;
  memleak_start();
  local_1f8 = "./mvcc_test2";
  local_200 = "./mvcc_test3";
  local_67._15_4_ = system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  memcpy(local_188,local_2f8,0xf8);
  fVar1 = fdb_open(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x14ec);
    tx_crash_recover_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x14ec,"void tx_crash_recover_test()");
    }
  }
  fdb_get_default_kvs_config();
  fVar1 = fdb_kvs_open_default
                    (in_stack_fffffffffffffca0,(fdb_kvs_handle **)in_stack_fffffffffffffc98,
                     (fdb_kvs_config *)0x1234d6);
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x14ef);
    tx_crash_recover_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x14ef,"void tx_crash_recover_test()");
    }
  }
  fVar1 = fdb_begin_transaction
                    (in_stack_fffffffffffffca8,
                     (fdb_isolation_level_t)((ulong)in_stack_fffffffffffffca0 >> 0x38));
  if (fVar1 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x14f3);
    tx_crash_recover_test::__test_pass = 0;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x14f3,"void tx_crash_recover_test()");
    }
  }
  local_67.doc_count._3_4_ = 0;
  do {
    if (9 < (int)local_67.doc_count._3_4_) {
      fVar1 = fdb_end_transaction((fdb_file_handle *)in_stack_fffffffffffffcb8,
                                  (fdb_commit_opt_t)(in_stack_fffffffffffffcb0 >> 0x38));
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x14fa);
        tx_crash_recover_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x14fa,"void tx_crash_recover_test()");
        }
      }
      fdb_compact(in_stack_fffffffffffffca0,(char *)in_stack_fffffffffffffc98);
      fVar1 = fdb_begin_transaction
                        (in_stack_fffffffffffffca8,
                         (fdb_isolation_level_t)((ulong)in_stack_fffffffffffffca0 >> 0x38));
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1501);
        tx_crash_recover_test::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x1501,"void tx_crash_recover_test()");
        }
      }
      local_67.doc_count._3_4_ = 0;
      do {
        if (9 < (int)local_67.doc_count._3_4_) {
          fVar1 = fdb_get_file_info((fdb_file_handle *)in_stack_fffffffffffffcd8,
                                    in_stack_fffffffffffffcd0);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1509);
            tx_crash_recover_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x1509,"void tx_crash_recover_test()");
            }
          }
          local_1f0 = local_1c0 / local_184;
          fdb_close((fdb_file_handle *)in_stack_fffffffffffffc98);
          fdb_shutdown();
          local_67._15_4_ =
               _disk_dump((char *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                          (size_t)in_stack_fffffffffffffca8);
          if ((int)local_67._15_4_ < 0) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1513);
            tx_crash_recover_test::__test_pass = 0;
            if ((int)local_67._15_4_ < 0) {
              __assert_fail("r >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x1513,"void tx_crash_recover_test()");
            }
          }
          local_67._15_4_ =
               _disk_dump((char *)in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,
                          (size_t)in_stack_fffffffffffffca8);
          if ((int)local_67._15_4_ < 0) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1517);
            tx_crash_recover_test::__test_pass = 0;
            if ((int)local_67._15_4_ < 0) {
              __assert_fail("r >= 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x1517,"void tx_crash_recover_test()");
            }
          }
          fVar1 = fdb_open(in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                           in_stack_fffffffffffffeb8);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x151b);
            tx_crash_recover_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x151b,"void tx_crash_recover_test()");
            }
          }
          fdb_get_default_kvs_config();
          fVar1 = fdb_kvs_open_default
                            (in_stack_fffffffffffffca0,(fdb_kvs_handle **)in_stack_fffffffffffffc98,
                             (fdb_kvs_config *)0x123b91);
          isolation_level = (fdb_isolation_level_t)((ulong)in_stack_fffffffffffffca0 >> 0x38);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x151e);
            tx_crash_recover_test::__test_pass = 0;
            if (fVar1 != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x151e,"void tx_crash_recover_test()");
            }
          }
          local_8c = fdb_begin_transaction(in_stack_fffffffffffffca8,isolation_level);
          if (local_8c != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1522);
            tx_crash_recover_test::__test_pass = 0;
            if (local_8c != FDB_RESULT_SUCCESS) {
              __assert_fail("status == FDB_RESULT_SUCCESS",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x1522,"void tx_crash_recover_test()");
            }
          }
          local_67.doc_count._3_4_ = 0;
          do {
            if (9 < (int)local_67.doc_count._3_4_) {
              fdb_abort_transaction((fdb_file_handle *)in_stack_fffffffffffffc98);
              if (local_8c != FDB_RESULT_SUCCESS) {
                fprintf(_stderr,"Test failed: %s %d\n",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x152b);
                tx_crash_recover_test::__test_pass = 0;
                if (local_8c != FDB_RESULT_SUCCESS) {
                  __assert_fail("status == FDB_RESULT_SUCCESS",
                                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                                ,0x152b,"void tx_crash_recover_test()");
                }
              }
              local_67.doc_count._3_4_ = 0;
              do {
                if (9 < (int)local_67.doc_count._3_4_) {
                  if (local_8c != FDB_RESULT_SUCCESS) {
                    fprintf(_stderr,"Test failed: %s %d\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                            ,0x1535);
                    tx_crash_recover_test::__test_pass = 0;
                    if (local_8c != FDB_RESULT_SUCCESS) {
                      __assert_fail("status == FDB_RESULT_SUCCESS",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                                    ,0x1535,"void tx_crash_recover_test()");
                    }
                  }
                  fdb_close((fdb_file_handle *)in_stack_fffffffffffffc98);
                  fdb_shutdown();
                  memleak_end();
                  if (tx_crash_recover_test::__test_pass == 0) {
                    fprintf(_stderr,"%s FAILED\n","crash recover test");
                  }
                  else {
                    fprintf(_stderr,"%s PASSED\n","crash recover test");
                  }
                  return;
                }
                sprintf((char *)&local_67,"key%d",(ulong)local_67.doc_count._3_4_);
                in_stack_fffffffffffffc98 = local_88;
                strlen((char *)&local_67);
                local_8c = fdb_get_kv(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                                      (size_t)in_stack_fffffffffffffcc8,
                                      &in_stack_fffffffffffffcc0->filename,
                                      (size_t *)in_stack_fffffffffffffcb8);
                if (local_8c != FDB_RESULT_SUCCESS) {
                  fprintf(_stderr,"Test failed: %s %d\n",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x1531);
                  tx_crash_recover_test::__test_pass = 0;
                  if (local_8c != FDB_RESULT_SUCCESS) {
                    __assert_fail("status == FDB_RESULT_SUCCESS",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                                  ,0x1531,"void tx_crash_recover_test()");
                  }
                }
                free(local_70);
                local_67.doc_count._3_4_ = local_67.doc_count._3_4_ + 1;
              } while( true );
            }
            sprintf((char *)&local_67,"key%d",(ulong)local_67.doc_count._3_4_);
            strlen((char *)&local_67);
            local_8c = fdb_del_kv(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                                  (size_t)in_stack_fffffffffffffcb8);
            if (local_8c != FDB_RESULT_SUCCESS) {
              fprintf(_stderr,"Test failed: %s %d\n",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1526);
              tx_crash_recover_test::__test_pass = 0;
              if (local_8c != FDB_RESULT_SUCCESS) {
                __assert_fail("status == FDB_RESULT_SUCCESS",
                              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                              ,0x1526,"void tx_crash_recover_test()");
              }
            }
            local_67.doc_count._3_4_ = local_67.doc_count._3_4_ + 1;
          } while( true );
        }
        sprintf((char *)&local_67,"key%d",(ulong)local_67.doc_count._3_4_);
        in_stack_fffffffffffffcc0 = &local_67;
        in_stack_fffffffffffffcb8 = local_88;
        strlen((char *)&local_67);
        fVar1 = fdb_del_kv(in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                           (size_t)in_stack_fffffffffffffcb8);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1505);
          tx_crash_recover_test::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x1505,"void tx_crash_recover_test()");
          }
        }
        local_67.doc_count._3_4_ = local_67.doc_count._3_4_ + 1;
      } while( true );
    }
    sprintf((char *)&local_67,"key%d",(ulong)local_67.doc_count._3_4_);
    in_stack_fffffffffffffcd0 = &local_67;
    in_stack_fffffffffffffcc8 = local_88;
    strlen((char *)&local_67);
    fVar1 = fdb_set_kv(in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                       (size_t)in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
                       (size_t)in_stack_fffffffffffffcb8);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x14f7);
      tx_crash_recover_test::__test_pass = 0;
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x14f7,"void tx_crash_recover_test()");
      }
    }
    local_67.doc_count._3_4_ = local_67.doc_count._3_4_ + 1;
  } while( true );
}

Assistant:

void tx_crash_recover_test()
{
    TEST_INIT();
    memleak_start();

    int i, r;
    char str[15];
    void *val;
    size_t vallen;

    fdb_file_handle *file;
    fdb_kvs_handle *kvs;
    fdb_status status;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_file_info file_info;
    uint64_t bid;
    const char *test_file = "./mvcc_test2";
    const char *test_file_c = "./mvcc_test3";

    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    status = fdb_open(&file, test_file, &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open_default(file, &kvs, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // set keys in transaction
    status = fdb_begin_transaction(file, FDB_ISOLATION_READ_UNCOMMITTED);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    for(i=0;i<10;i++){
        sprintf(str, "key%d", i);
        status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    status = fdb_end_transaction(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // custom compact
    fdb_compact(file, test_file_c);

    // begin a tx to delete keys
    status = fdb_begin_transaction(file, FDB_ISOLATION_READ_UNCOMMITTED);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    for(i=0;i<10;i++){
        sprintf(str, "key%d", i);
        status = fdb_del_kv(kvs, str, strlen(str));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_get_file_info(file, &file_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    bid = file_info.file_size / config.blocksize;

    // simulate crash
    fdb_close(file);
    fdb_shutdown();

    // Now append 9K of non-block aligned garbage at the end of the file..
    r = _disk_dump(test_file_c, bid * config.blocksize,
                  (config.blocksize * 2) + (config.blocksize / 4));
    TEST_CHK(r >= 0);

    // also write non-block aligned garbage to old compact file
    r = _disk_dump(test_file, (bid + 2)*4*config.blocksize, config.blocksize/4);
    TEST_CHK(r >= 0);

    // reopen
    status = fdb_open(&file, test_file_c, &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open_default(file, &kvs, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // restart tx to delete keys
    status = fdb_begin_transaction(file, FDB_ISOLATION_READ_UNCOMMITTED);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    for(i=0;i<10;i++){
        sprintf(str, "key%d", i);
        status = fdb_del_kv(kvs, str, strlen(str));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    // abort tx
    fdb_abort_transaction(file);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // keys from original tx should be recoverable
    for(i=0;i<10;i++){
       sprintf(str, "key%d", i);
       status = fdb_get_kv(kvs, str, strlen(str), &val, &vallen);
       TEST_CHK(status == FDB_RESULT_SUCCESS);
       free(val);
    }

    TEST_CHK(status == FDB_RESULT_SUCCESS);

    fdb_close(file);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("crash recover test");
}